

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::RsRuleSyntax::RsRuleSyntax
          (RsRuleSyntax *this,RandJoinClauseSyntax *randJoin,
          SyntaxList<slang::syntax::RsProdSyntax> *prods,RsWeightClauseSyntax *weightClause)

{
  bool bVar1;
  reference ppRVar2;
  size_t in_RCX;
  SyntaxNode *in_RSI;
  SyntaxList<slang::syntax::RsProdSyntax> *in_RDI;
  RsProdSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RsProdSyntax> *__range2;
  SyntaxList<slang::syntax::RsProdSyntax> *in_stack_ffffffffffffffc0;
  span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
  local_30;
  size_t *local_28;
  size_t local_20;
  SyntaxNode *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  SyntaxNode::SyntaxNode((SyntaxNode *)in_RDI,RsRule);
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = local_10;
  SyntaxList<slang::syntax::RsProdSyntax>::SyntaxList(in_stack_ffffffffffffffc0,in_RDI);
  in_RDI[1].super_SyntaxListBase.childCount = local_20;
  if ((in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode != (SyntaxNode *)0x0) {
    ((in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode)->parent = (SyntaxNode *)in_RDI;
  }
  (in_RDI->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>)._M_extent.
  _M_extent_value = (size_t)in_RDI;
  local_28 = &(in_RDI->super_SyntaxListBase).childCount;
  local_30._M_current =
       (RsProdSyntax **)
       std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *)in_RDI);
  std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffffc0 = (SyntaxList<slang::syntax::RsProdSyntax> *)*ppRVar2;
    *(SyntaxList<slang::syntax::RsProdSyntax> **)
     &(in_stack_ffffffffffffffc0->super_SyntaxListBase).super_SyntaxNode = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::RsProdSyntax_**,_std::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  if (in_RDI[1].super_SyntaxListBase.childCount != 0) {
    *(SyntaxList<slang::syntax::RsProdSyntax> **)(in_RDI[1].super_SyntaxListBase.childCount + 8) =
         in_RDI;
  }
  return;
}

Assistant:

RsRuleSyntax(RandJoinClauseSyntax* randJoin, const SyntaxList<RsProdSyntax>& prods, RsWeightClauseSyntax* weightClause) :
        SyntaxNode(SyntaxKind::RsRule), randJoin(randJoin), prods(prods), weightClause(weightClause) {
        if (this->randJoin) this->randJoin->parent = this;
        this->prods.parent = this;
        for (auto child : this->prods)
            child->parent = this;
        if (this->weightClause) this->weightClause->parent = this;
    }